

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

char * __thiscall cmCPackGenerator::GetPackagingInstallPrefix(cmCPackGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCPackLog *this_00;
  _Alloc_hider msg;
  char *pcVar2;
  size_t sVar3;
  ostringstream cmCPackLog_msg;
  string local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"GetPackagingInstallPrefix: \'",0x1c);
  paVar1 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"CPACK_PACKAGING_INSTALL_PREFIX","");
  pcVar2 = GetOption(this,&local_1b8);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)&local_1b8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\'",1);
  std::ios::widen((char)(ostream *)local_198 + (char)*(_func_int **)(local_198._0_8_ + -0x18));
  std::ostream::put((char)local_198);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  this_00 = this->Logger;
  std::__cxx11::stringbuf::str();
  msg._M_p = local_1b8._M_dataplus._M_p;
  sVar3 = strlen(local_1b8._M_dataplus._M_p);
  cmCPackLog::Log(this_00,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x503,msg._M_p,sVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  local_198._0_8_ = local_198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"CPACK_PACKAGING_INSTALL_PREFIX","");
  pcVar2 = GetOption(this,(string *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  return pcVar2;
}

Assistant:

const char* cmCPackGenerator::GetPackagingInstallPrefix()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "GetPackagingInstallPrefix: '"
    << this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX") << "'" << std::endl);

  return this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
}